

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall format::mtx_error::~mtx_error(mtx_error *this)

{
  ~mtx_error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

mtx_error (std::string filename, std::string msg="Error loading matrix")
  : std::runtime_error(msg)
  {
   filename_ = filename;
  }